

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_io.c
# Opt level: O0

void * vinlet_newsig(t_symbol *s,int argc,t_atom *argv)

{
  int iVar1;
  t_object *owner;
  _glist *p_Var2;
  _inlet *p_Var3;
  _binbuf **pp_Var4;
  t_symbol *s_00;
  _outlet *p_Var5;
  int iVar6;
  int method;
  t_vinlet *x;
  t_atom *argv_local;
  int argc_local;
  t_symbol *s_local;
  
  owner = (t_object *)pd_new(vinlet_class);
  p_Var2 = canvas_getcurrent();
  owner[1].te_g.g_pd = (t_pd)p_Var2;
  p_Var3 = canvas_addinlet((_glist *)owner[1].te_g.g_pd,(t_pd *)owner,&s_signal);
  owner[1].te_g.g_next = (_gobj *)p_Var3;
  p_Var3 = (_inlet *)getbytes(0);
  owner[1].te_outlet = (_outlet *)p_Var3;
  owner[1].te_inlet = p_Var3;
  *(undefined4 *)&owner[1].te_binbuf = 0;
  owner[2].te_binbuf = (_binbuf *)0x0;
  owner[3].te_xpix = 0;
  owner[3].te_ypix = 0;
  owner[3].te_width = 0;
  *(undefined2 *)&owner[3].field_0x2e = 0;
  outlet_new(owner,&s_signal);
  inlet_new(owner,&(owner[1].te_g.g_next)->g_pd,(t_symbol *)0x0,(t_symbol *)0x0);
  resample_init((t_resample *)&owner[2].te_outlet);
  *(undefined4 *)&owner[2].te_outlet = 0xffffffff;
  x = (t_vinlet *)argv;
  argv_local._4_4_ = argc;
  while (iVar6 = argv_local._4_4_ + -1, 0 < argv_local._4_4_) {
    pp_Var4 = &(x->x_obj).te_binbuf;
    s_00 = atom_getsymbol((t_atom *)x);
    iVar1 = symbol2resamplemethod(s_00);
    x = (t_vinlet *)pp_Var4;
    argv_local._4_4_ = iVar6;
    if (-1 < iVar1) {
      *(int *)&owner[2].te_outlet = iVar1;
    }
  }
  p_Var5 = outlet_new(owner,(t_symbol *)0x0);
  *(_outlet **)&owner[3].te_xpix = p_Var5;
  return owner;
}

Assistant:

static void *vinlet_newsig(t_symbol *s, int argc, t_atom *argv)
{
    t_vinlet *x = (t_vinlet *)pd_new(vinlet_class);
    x->x_canvas = canvas_getcurrent();
    x->x_inlet = canvas_addinlet(x->x_canvas, &x->x_obj.ob_pd, &s_signal);
    x->x_endbuf = x->x_buf = (t_sample *)getbytes(0);
    x->x_bufsize = 0;
    x->x_directsignal = 0;
    x->x_fwdout = 0;
    outlet_new(&x->x_obj, &s_signal);
    inlet_new(&x->x_obj, (t_pd *)x->x_inlet, 0, 0);
    resample_init(&x->x_updown);

    /* this should be though over:
     * it might prove hard to provide consistency between labeled up- & downsampling methods
     * maybe indices would be better...
     *
     * up till now we provide several upsampling methods and 1 single downsampling method (no filtering !)
     */
    x->x_updown.method = -1;
    while(argc-->0)
    {
        int method;
        s = atom_getsymbol(argv++);
        method = symbol2resamplemethod(s);
        if (method >= 0)
            x->x_updown.method = method;
    }
    x->x_fwdout = outlet_new(&x->x_obj, 0);
    return (x);
}